

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleDemo.cpp
# Opt level: O2

void demo2(void)

{
  ostream *poVar1;
  IMLE<1,_1,_FastLinearExpert> imleObj;
  allocator local_429;
  string local_428;
  Param local_408;
  IMLE<1,_1,_FastLinearExpert> local_370;
  
  IMLE<1,_1,_FastLinearExpert>::Param::Param(&local_408);
  local_408.Psi0.super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array
  [0] = (PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>)
        (DenseStorage<double,_1,_1,_1,_0>)0x3fb999999999999a;
  local_408.sigma0 = 1.0;
  local_408.p0 = 0.2;
  poVar1 = std::operator<<((ostream *)&std::cout,"\t --- Param constructor: ---");
  std::endl<char,std::char_traits<char>>(poVar1);
  IMLE<1,_1,_FastLinearExpert>::IMLE(&local_370,&local_408,0x800);
  std::__cxx11::string::string((string *)&local_428,"cos1D.xml",&local_429);
  IMLE<1,_1,_FastLinearExpert>::createDefaultParamFile(&local_428);
  std::__cxx11::string::_M_dispose();
  cos1D_testSaveLoadAndParamHandling<IMLE<1,1,FastLinearExpert>>(&local_370);
  IMLE<1,_1,_FastLinearExpert>::~IMLE(&local_370);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void demo2()
{
    const int d = 1;    //Input dimension
    const int D = 1;    //Output dimension

    //      IMLE Parameters
    IMLE<d,D>::Param param;
    param.Psi0 = IMLE<d,D>::X::Constant(0.1);
    param.sigma0 = 1.0;
    param.p0 = 0.2;

    // Param constructor:
    cout << "\t --- Param constructor: ---" << endl;
    IMLE<d,D> imleObj(param);

    // Default Param File:
    IMLE<d,D>::createDefaultParamFile("cos1D.xml");

    cos1D_testSaveLoadAndParamHandling(imleObj );
}